

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O0

bool __thiscall SMBusAnalyzer::GetSignal(SMBusAnalyzer *this,SMBusSignalState *state)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  U64 UVar5;
  ulong uVar6;
  AnalyzerChannelData *pAVar7;
  ulong uVar8;
  SMBusSignal SVar9;
  U64 end_sample;
  U64 frame_offset;
  U64 frame_begin;
  U64 start_sample;
  AnalyzerChannelData *nearestEdgeChannel;
  bool ret_val;
  SMBusSignalState *state_local;
  SMBusAnalyzer *this_local;
  
  while( true ) {
    bVar1 = true;
    SMBusSignalState::Clear(state);
    start_sample = (U64)GetNearestTransitionChannel(this);
    iVar2 = AnalyzerChannelData::GetBitState();
    if (iVar2 == 1) {
      lVar3 = AnalyzerChannelData::GetSampleNumber();
      if ((AnalyzerChannelData *)start_sample == this->mSMBDAT) {
        bVar1 = false;
        lVar4 = AnalyzerChannelData::GetSampleNumber();
        UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
        state->sample_marker = UVar5;
        iVar2 = AnalyzerChannelData::GetBitState();
        if (iVar2 == 1) {
          state->bus_signal = SMB_Start;
        }
        else {
          state->bus_signal = SMB_Stop;
        }
        start_sample = (U64)AdvanceAllTo(this,state->sample_marker);
        uVar6 = AnalyzerChannelData::DoMoreTransitionsExistInCurrentData();
        if ((uVar6 & 1) == 0) {
          end_sample = state->sample_marker - lVar4;
        }
        else {
          lVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
          if (lVar4 - state->sample_marker < state->sample_marker - lVar3) {
            uVar6 = lVar4 - state->sample_marker;
          }
          else {
            uVar6 = state->sample_marker - lVar3;
          }
          end_sample = uVar6 >> 1;
        }
        state->sample_begin = state->sample_marker - end_sample;
        state->sample_end = state->sample_marker + end_sample;
        if ((state->bus_signal == SMB_Start) &&
           ((AnalyzerChannelData *)start_sample == this->mSMBCLK)) {
          UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
          AdvanceAllTo(this,UVar5);
        }
      }
      else {
        UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
        start_sample = (U64)AdvanceAllTo(this,UVar5);
      }
    }
    if (bVar1 == false) break;
    iVar2 = AnalyzerChannelData::GetBitState();
    if (iVar2 != 0) {
      __assert_fail("mSMBCLK->GetBitState() == BIT_LOW",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusAnalyzer.cpp"
                    ,0x8d,"bool SMBusAnalyzer::GetSignal(SMBusSignalState &)");
    }
    if ((AnalyzerChannelData *)start_sample == this->mSMBDAT) {
      UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
      state->sample_begin = UVar5;
      start_sample = (U64)AdvanceAllTo(this,state->sample_begin);
    }
    else {
      lVar3 = AnalyzerChannelData::GetSampleNumber();
      lVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
      state->sample_begin = (ulong)(lVar3 + lVar4) >> 1;
    }
    if ((AnalyzerChannelData *)start_sample == this->mSMBCLK) {
      UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
      pAVar7 = AdvanceAllTo(this,UVar5);
      UVar5 = AnalyzerChannelData::GetSampleNumber();
      state->sample_rising_clk = UVar5;
      if (pAVar7 == this->mSMBCLK) {
        lVar3 = AnalyzerChannelData::GetSampleOfNextEdge();
        state->sample_marker = lVar3 + state->sample_rising_clk >> 1;
        if ((state->sample_rising_clk < state->sample_marker) &&
           (uVar6 = state->sample_marker, uVar8 = AnalyzerChannelData::GetSampleOfNextEdge(),
           uVar6 < uVar8)) {
          AdvanceAllTo(this,state->sample_marker);
        }
        iVar2 = AnalyzerChannelData::GetBitState();
        SVar9 = SMB_Zero;
        if (iVar2 == 1) {
          SVar9 = SMB_One;
        }
        state->bus_signal = SVar9;
        UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
        pAVar7 = AdvanceAllTo(this,UVar5);
        if (pAVar7 == this->mSMBCLK) {
          lVar3 = AnalyzerChannelData::GetSampleNumber();
          lVar4 = AnalyzerChannelData::GetSampleOfNextEdge();
          state->sample_end = (ulong)(lVar3 + lVar4) >> 1;
        }
        else {
          UVar5 = AnalyzerChannelData::GetSampleOfNextEdge();
          state->sample_end = UVar5;
        }
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool SMBusAnalyzer::GetSignal( SMBusSignalState& state )
{
func_begin:

    bool ret_val = true;

    state.Clear();

    AnalyzerChannelData* nearestEdgeChannel = GetNearestTransitionChannel();

    // first check for a start or stop
    if( mSMBCLK->GetBitState() == BIT_HIGH )
    {
        U64 start_sample = mSMBCLK->GetSampleNumber();
        if( nearestEdgeChannel == mSMBDAT )
        {
            ret_val = false;

            // remember where we began in case this is the last packet
            U64 frame_begin = mSMBDAT->GetSampleNumber();

            state.sample_marker = mSMBDAT->GetSampleOfNextEdge();

            if( mSMBDAT->GetBitState() == BIT_HIGH )
                state.bus_signal = SMB_Start;
            else
                state.bus_signal = SMB_Stop;

            // move all to the SMBDAT transition
            nearestEdgeChannel = AdvanceAllTo( state.sample_marker );

            // set the begin and ending samples for the frame
            U64 frame_offset = 0;
            if( nearestEdgeChannel->DoMoreTransitionsExistInCurrentData() )
            {
                U64 end_sample = nearestEdgeChannel->GetSampleOfNextEdge();
                if( end_sample - state.sample_marker < state.sample_marker - start_sample )
                    frame_offset = ( end_sample - state.sample_marker ) / 2;
                else
                    frame_offset = ( state.sample_marker - start_sample ) / 2;
            }
            else
            {
                frame_offset = state.sample_marker - frame_begin;
            }

            state.sample_begin = state.sample_marker - frame_offset;
            state.sample_end = state.sample_marker + frame_offset;

            // skip the falling SMBCLK if we have a start
            // this prepares us for the first bit
            if( state.bus_signal == SMB_Start && nearestEdgeChannel == mSMBCLK )
                AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );
        }
        else
        {
            // SMBCLK falls - skip to it
            nearestEdgeChannel = AdvanceAllTo( nearestEdgeChannel->GetSampleOfNextEdge() );
        }
    }

    // if we didn't find a start or stop above try parsing a bit
    if( ret_val )
    {
        // we must have a low SMBCLK at this point
        assert( mSMBCLK->GetBitState() == BIT_LOW );

        // skip the preparing of SMBDAT for the rising SMBCLK egde
        if( nearestEdgeChannel == mSMBDAT )
        {
            state.sample_begin = mSMBDAT->GetSampleOfNextEdge();
            nearestEdgeChannel = AdvanceAllTo( state.sample_begin );
        }
        else
        {
            state.sample_begin = ( mSMBCLK->GetSampleNumber() + mSMBCLK->GetSampleOfNextEdge() ) / 2;
        }

        // do we have a rising SMBCLK at this point?
        if( nearestEdgeChannel == mSMBCLK )
        {
            nearestEdgeChannel = AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );

            state.sample_rising_clk = mSMBCLK->GetSampleNumber();

            // do we have a falling SMBCLK edge next?
            if( nearestEdgeChannel == mSMBCLK )
            {
                // sample the state of SMBDAT
                state.sample_marker = ( mSMBCLK->GetSampleOfNextEdge() + state.sample_rising_clk ) / 2;

                if( state.sample_marker > state.sample_rising_clk && state.sample_marker < mSMBCLK->GetSampleOfNextEdge() )
                    nearestEdgeChannel = AdvanceAllTo( state.sample_marker );

                state.bus_signal = mSMBDAT->GetBitState() == BIT_HIGH ? SMB_One : SMB_Zero;

                // advance to SMBCLK falling edge
                nearestEdgeChannel = AdvanceAllTo( mSMBCLK->GetSampleOfNextEdge() );

                // where to put the end of state depends on where the next transition happens
                if( nearestEdgeChannel == mSMBCLK )
                    state.sample_end = ( mSMBCLK->GetSampleNumber() + mSMBCLK->GetSampleOfNextEdge() ) / 2;
                else
                    state.sample_end = mSMBDAT->GetSampleOfNextEdge();
            }
            else
            {
                // go back to parsing start/stop
                goto func_begin;
            }
        }
        else
        {
            // go back to parsing start/stop
            goto func_begin;
        }
    }

    return ret_val;
}